

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

MVNParameter * __thiscall caffe::V1LayerParameter::mutable_mvn_param(V1LayerParameter *this)

{
  MVNParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_mvn_param(this);
  if (this->mvn_param_ == (MVNParameter *)0x0) {
    this_00 = (MVNParameter *)operator_new(0x20);
    MVNParameter::MVNParameter(this_00);
    this->mvn_param_ = this_00;
  }
  return this->mvn_param_;
}

Assistant:

inline ::caffe::MVNParameter* V1LayerParameter::mutable_mvn_param() {
  set_has_mvn_param();
  if (mvn_param_ == NULL) {
    mvn_param_ = new ::caffe::MVNParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.mvn_param)
  return mvn_param_;
}